

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O3

uint32 cnt_twig(dtree_node_t *node)

{
  dtree_node_t *node_00;
  uint32 uVar1;
  int iVar2;
  dtree_node_t *pdVar3;
  int iVar4;
  
  iVar4 = 0;
LAB_001184f2:
  while( true ) {
    pdVar3 = node;
    node_00 = pdVar3->y;
    if ((node_00 == (dtree_node_t *)0x0) && (pdVar3->n == (dtree_node_str *)0x0)) {
      iVar2 = 0;
      goto LAB_0011855d;
    }
    if ((node_00->y == (dtree_node_str *)0x0) && (node_00->n == (dtree_node_str *)0x0)) break;
    if ((pdVar3->n->y != (dtree_node_str *)0x0) ||
       (node = node_00, pdVar3->n->n != (dtree_node_str *)0x0)) goto LAB_00118528;
  }
  if ((pdVar3->n->y != (dtree_node_str *)0x0) || (pdVar3->n->n != (dtree_node_str *)0x0))
  goto LAB_00118547;
  iVar2 = 1;
LAB_0011855d:
  return iVar2 + iVar4;
LAB_00118547:
  node = pdVar3->n;
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
LAB_00118528:
    uVar1 = cnt_twig(node_00);
    iVar4 = iVar4 + uVar1;
    node = pdVar3->n;
  }
  goto LAB_001184f2;
}

Assistant:

uint32
cnt_twig(dtree_node_t *node)
{
    if (IS_LEAF(node)) {
	return 0;
    } else if (IS_LEAF(node->y) && IS_LEAF(node->n)) {
	return 1;
    }
    else {
	if (IS_LEAF(node->y) && !IS_LEAF(node->n)) {
	    return cnt_twig(node->n);
	}
	else if (!IS_LEAF(node->y) && IS_LEAF(node->n)) {
	    return cnt_twig(node->y);
	}
	else 
	    return cnt_twig(node->y) + cnt_twig(node->n);
    }
}